

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O2

Vec_Ptr_t * createArenaLi(Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers,Vec_Ptr_t *vArenaSignal)

{
  int nCap;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar1;
  int i;
  
  if (vBarriers != (Vec_Ptr_t *)0x0) {
    nCap = vBarriers->nSize;
    i = 0;
    if (0 < nCap) {
      p = Vec_PtrAlloc(nCap);
      for (; nCap != i; i = i + 1) {
        pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(vArenaSignal,i);
        pAVar1 = Aig_ObjCreateCo(pAigNew,pAVar1);
        Vec_PtrPush(p,pAVar1);
      }
      return p;
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * createArenaLi( Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers, Vec_Ptr_t *vArenaSignal )
{
    Vec_Ptr_t *vArenaLi;
    int barrierCount;
    int i;
    Aig_Obj_t *pObj, *pObjDriver;

    if( vBarriers == NULL )
        return NULL;

    barrierCount = Vec_PtrSize(vBarriers);
    if( barrierCount <= 0 )
        return NULL;

    vArenaLi = Vec_PtrAlloc(barrierCount);    
    for( i=0; i<barrierCount; i++ )
    {
        pObjDriver = (Aig_Obj_t *)Vec_PtrEntry( vArenaSignal, i );
        pObj = Aig_ObjCreateCo( pAigNew, pObjDriver );
        Vec_PtrPush( vArenaLi, pObj );
    }

    return vArenaLi;
}